

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O3

void ra_evictset(ASMState *as,RegSet drop)

{
  uint uVar1;
  uint uVar2;
  
  as->modset = as->modset | drop;
  uVar2 = ~as->freeset & drop & 0xffff0000;
  while (uVar2 != 0) {
    uVar1 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    ra_restore(as,(uint)(ushort)as->cost[uVar1]);
    uVar2 = uVar2 & ~(1 << (uVar1 & 0x1f));
    if (as->mcp < as->mclim) goto LAB_0014cb79;
  }
  uVar2 = ~as->freeset & drop;
  do {
    if (uVar2 == 0) {
      return;
    }
    uVar1 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
      }
    }
    ra_restore(as,(uint)(ushort)as->cost[uVar1]);
    uVar2 = uVar2 & ~(1 << (uVar1 & 0x1f));
  } while (as->mclim <= as->mcp);
LAB_0014cb79:
  asm_mclimit(as);
}

Assistant:

static void ra_evictset(ASMState *as, RegSet drop)
{
  RegSet work;
  as->modset |= drop;
#if !LJ_SOFTFP
  work = (drop & ~as->freeset) & RSET_FPR;
  while (work) {
    Reg r = rset_pickbot(work);
    ra_restore(as, regcost_ref(as->cost[r]));
    rset_clear(work, r);
    checkmclim(as);
  }
#endif
  work = (drop & ~as->freeset);
  while (work) {
    Reg r = rset_pickbot(work);
    ra_restore(as, regcost_ref(as->cost[r]));
    rset_clear(work, r);
    checkmclim(as);
  }
}